

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O0

void __thiscall
gimage::Image<float,_gimage::PixelTraits<float>_>::setImage
          (Image<float,_gimage::PixelTraits<float>_> *this,
          Image<float,_gimage::PixelTraits<float>_> *a)

{
  void *__dest;
  int iVar1;
  float *__src;
  undefined4 extraout_var;
  Image<float,_gimage::PixelTraits<float>_> *in_RSI;
  long in_RDI;
  long in_stack_00000018;
  long in_stack_00000020;
  
  getWidth(in_RSI);
  getHeight(in_RSI);
  getDepth(in_RSI);
  setSize(this,(long)a,in_stack_00000020,in_stack_00000018);
  __dest = *(void **)(in_RDI + 0x20);
  __src = getPtr(in_RSI,0,0,0);
  iVar1 = std::abs((int)*(undefined8 *)(in_RDI + 0x18));
  memcpy(__dest,__src,CONCAT44(extraout_var,iVar1) << 2);
  return;
}

Assistant:

void setImage(const Image<T> &a)
    {
      setSize(a.getWidth(), a.getHeight(), a.getDepth());
      memcpy(pixel, a.getPtr(0, 0, 0), std::abs(n)*sizeof(T));
    }